

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

string cs_impl::path_cs_ext::name_abi_cxx11_(path_info *info)

{
  string *in_RSI;
  proxy *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return (string)in_RDI;
}

Assistant:

string name(const path_info &info)
		{
			return info.name;
		}